

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImpl::WindowImpl(WindowImpl *this)

{
  undefined8 *puVar1;
  undefined3 uVar2;
  long lVar3;
  JoystickManager *pJVar4;
  JoystickState *pJVar5;
  long lVar6;
  JoystickState *pJVar7;
  float (*pafVar8) [8];
  JoystickState *pJVar9;
  byte bVar10;
  
  bVar10 = 0;
  this->_vptr_WindowImpl = (_func_int **)&PTR__WindowImpl_001e8a48;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_events).c.super__Deque_base<sf::Event,_std::allocator<sf::Event>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<sf::Event,_std::allocator<sf::Event>_>::_M_initialize_map
            ((_Deque_base<sf::Event,_std::allocator<sf::Event>_> *)&this->m_events,0);
  lVar3 = 0x5c;
  do {
    *(undefined1 *)((long)this->m_joystickStates[0].axes + lVar3 + -0x60) = 0;
    puVar1 = (undefined8 *)((long)this->m_joystickStates[0].axes + lVar3 + -0x5c);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->m_joystickStates[0].axes + lVar3 + -0x4c);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->m_joystickStates[0].axes + lVar3 + -0x3c);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->m_joystickStates[0].axes + lVar3 + -0x2c);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar3 = lVar3 + 0x44;
  } while (lVar3 != 0x27c);
  this->m_sensorValue[4].x = 0.0;
  this->m_sensorValue[4].y = 0.0;
  *(undefined8 *)&this->m_sensorValue[4].z = 0;
  *(undefined8 *)&this->m_sensorValue[2].z = 0;
  this->m_sensorValue[3].y = 0.0;
  this->m_sensorValue[3].z = 0.0;
  this->m_sensorValue[1].y = 0.0;
  this->m_sensorValue[1].z = 0.0;
  this->m_sensorValue[2].x = 0.0;
  this->m_sensorValue[2].y = 0.0;
  this->m_sensorValue[0].x = 0.0;
  this->m_sensorValue[0].y = 0.0;
  *(undefined8 *)&this->m_sensorValue[0].z = 0;
  this->m_sensorValue[5].y = 0.0;
  this->m_sensorValue[5].z = 0.0;
  this->m_joystickThreshold = 0.1;
  pJVar4 = JoystickManager::getInstance();
  JoystickManager::update(pJVar4);
  pJVar9 = this->m_joystickStates;
  pafVar8 = this->m_previousAxes;
  lVar3 = 0;
  do {
    pJVar4 = JoystickManager::getInstance();
    pJVar5 = JoystickManager::getState(pJVar4,(uint)lVar3);
    pJVar7 = pJVar9;
    for (lVar6 = 0x11; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar2 = *(undefined3 *)&pJVar5->field_0x1;
      pJVar7->connected = pJVar5->connected;
      *(undefined3 *)&pJVar7->field_0x1 = uVar2;
      pJVar5 = (JoystickState *)((long)pJVar5 + (ulong)bVar10 * -8 + 4);
      pJVar7 = (JoystickState *)((long)pJVar7 + (ulong)bVar10 * -8 + 4);
    }
    *(float *)((long)pafVar8 + 0x10) = 0.0;
    *(float *)((long)pafVar8 + 0x14) = 0.0;
    *(float *)((long)pafVar8 + 0x18) = 0.0;
    *(float *)((long)pafVar8 + 0x1c) = 0.0;
    *(float *)((long)pafVar8 + 0) = 0.0;
    *(float *)((long)pafVar8 + 4) = 0.0;
    *(float *)((long)pafVar8 + 8) = 0.0;
    *(float *)((long)pafVar8 + 0xc) = 0.0;
    lVar3 = lVar3 + 1;
    pJVar9 = pJVar9 + 1;
    pafVar8 = pafVar8 + 1;
  } while (lVar3 != 8);
  this->m_sensorValue[4].x = 0.0;
  this->m_sensorValue[4].y = 0.0;
  *(undefined8 *)&this->m_sensorValue[4].z = 0;
  *(undefined8 *)&this->m_sensorValue[2].z = 0;
  this->m_sensorValue[3].y = 0.0;
  this->m_sensorValue[3].z = 0.0;
  this->m_sensorValue[1].y = 0.0;
  this->m_sensorValue[1].z = 0.0;
  this->m_sensorValue[2].x = 0.0;
  this->m_sensorValue[2].y = 0.0;
  this->m_sensorValue[0].x = 0.0;
  this->m_sensorValue[0].y = 0.0;
  *(undefined8 *)&this->m_sensorValue[0].z = 0;
  this->m_sensorValue[5].y = 0.0;
  this->m_sensorValue[5].z = 0.0;
  return;
}

Assistant:

WindowImpl::WindowImpl() :
m_joystickThreshold(0.1f)
{
    // Get the initial joystick states
    JoystickManager::getInstance().update();
    for (unsigned int i = 0; i < Joystick::Count; ++i)
    {
        m_joystickStates[i] = JoystickManager::getInstance().getState(i);
        std::fill_n(m_previousAxes[i], static_cast<std::size_t>(Joystick::AxisCount), 0.f);
    }

    // Get the initial sensor states
    for (unsigned int i = 0; i < Sensor::Count; ++i)
        m_sensorValue[i] = Vector3f(0, 0, 0);
}